

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_classes.cc
# Opt level: O2

bool __thiscall
TolerancePicker::operator()
          (TolerancePicker *this,
          sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *sample
          ,cvector *actual)

{
  ostream *poVar1;
  double dVar2;
  
  dVar2 = PhaseSubtractor::phase_difference((PhaseSubtractor *)this,sample,actual);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Output=");
  poVar1 = std::operator<<(poVar1,(complex *)
                                  (actual->
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
  std::operator<<(poVar1," PhaseError=");
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0.05 < dVar2;
}

Assistant:

bool operator()(const learning::sample<cvector> &sample, const cvector &actual) const {
		double err = phase_difference(sample, actual);

		cerr << "Output=" << actual[0] << " PhaseError=" << err << endl;

		return err > TOLERANCE;
	}